

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashList_Create(ktxHashList **ppHl)

{
  ktxHashList *pHead;
  undefined8 *in_RDI;
  ktxHashList *hl;
  undefined4 local_4;
  
  pHead = (ktxHashList *)malloc(8);
  if (pHead == (ktxHashList *)0x0) {
    local_4 = KTX_OUT_OF_MEMORY;
  }
  else {
    ktxHashList_Construct(pHead);
    *in_RDI = pHead;
    local_4 = KTX_SUCCESS;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashList_Create(ktxHashList** ppHl)
{
    ktxHashList* hl = (ktxHashList*)malloc(sizeof (ktxKVListEntry*));
    if (hl == NULL)
        return KTX_OUT_OF_MEMORY;

    ktxHashList_Construct(hl);
    *ppHl = hl;
    return KTX_SUCCESS;
}